

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryFile.hpp
# Opt level: O0

void __thiscall
supermap::io::TemporaryFile::TemporaryFile
          (TemporaryFile *this,path *path,shared_ptr<supermap::io::FileManager> *manager)

{
  shared_ptr<supermap::io::FileManager> *in_RDX;
  long in_RDI;
  path *in_stack_ffffffffffffffb8;
  path *in_stack_ffffffffffffffd8;
  FileManager *in_stack_ffffffffffffffe0;
  
  std::filesystem::__cxx11::path::operator_cast_to_string(in_stack_ffffffffffffffb8);
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            (in_RDX,(shared_ptr<supermap::io::FileManager> *)in_stack_ffffffffffffffb8);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x155947);
  FileManager::create(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit TemporaryFile(const std::filesystem::path &path, std::shared_ptr<FileManager> manager)
        : path_(path), manager_(std::move(manager)) {
        manager_->create(path);
    }